

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qtoolbox.cpp
# Opt level: O3

int __thiscall QToolBox::qt_metacall(QToolBox *this,Call _c,int _id,void **_a)

{
  uint _id_00;
  undefined8 *puVar1;
  
  _id_00 = QFrame::qt_metacall(&this->super_QFrame,_c,_id,_a);
  if ((int)_id_00 < 0) {
    return _id_00;
  }
  if (BindableProperty < _c) {
    return _id_00;
  }
  if ((0x14eU >> (_c & 0x1f) & 1) != 0) {
    qt_static_metacall((QObject *)this,_c,_id_00,_a);
    return _id_00 - 2;
  }
  if (_c == InvokeMetaMethod) {
    if (_id_00 < 5) {
      qt_static_metacall((QObject *)this,InvokeMetaMethod,_id_00,_a);
    }
  }
  else {
    if (_c != RegisterMethodArgumentMetaType) {
      return _id_00;
    }
    if (_id_00 < 5) {
      if (_id_00 == 2) {
        puVar1 = (undefined8 *)*_a;
        if (*_a[1] == 0) {
          *puVar1 = &QtPrivate::QMetaTypeInterfaceWrapper<QWidget_*>::metaType;
          goto LAB_004b8ec6;
        }
      }
      else {
        puVar1 = (undefined8 *)*_a;
      }
      *puVar1 = 0;
    }
  }
LAB_004b8ec6:
  return _id_00 - 5;
}

Assistant:

int QToolBox::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QFrame::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 5)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 5;
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 5)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 5;
    }
    if (_c == QMetaObject::ReadProperty || _c == QMetaObject::WriteProperty
            || _c == QMetaObject::ResetProperty || _c == QMetaObject::BindableProperty
            || _c == QMetaObject::RegisterPropertyMetaType) {
        qt_static_metacall(this, _c, _id, _a);
        _id -= 2;
    }
    return _id;
}